

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O3

DOMDocument * __thiscall xercesc_4_0::DOMNodeImpl::getOwnerDocument(DOMNodeImpl *this)

{
  _func_int **pp_Var1;
  int iVar2;
  long *plVar3;
  long lVar4;
  undefined4 extraout_var;
  DOMDocument *pDVar5;
  DOMException *this_00;
  
  if ((*(uint *)&this->flags >> 10 & 1) == 0) {
    if (((this->fContainingNode == (DOMNode *)0x0) ||
        (plVar3 = (long *)__dynamic_cast(this->fContainingNode,&DOMNode::typeinfo,
                                         &HasDOMParentImpl::typeinfo,0xfffffffffffffffe),
        plVar3 == (long *)0x0)) || (lVar4 = (**(code **)(*plVar3 + 0x18))(plVar3), lVar4 == 0)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
    }
    lVar4 = (**(code **)(*plVar3 + 0x18))(plVar3);
    if (lVar4 == 0) {
      pDVar5 = (DOMDocument *)0x0;
    }
    else {
      pDVar5 = *(DOMDocument **)(lVar4 + 0x10);
    }
  }
  else {
    pp_Var1 = this->fOwnerNode->_vptr_DOMNode;
    if ((*(uint *)&this->flags & 8) == 0) {
      iVar2 = (*pp_Var1[4])();
      if (iVar2 != 9) {
        __assert_fail("fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE",
                      "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeImpl.cpp"
                      ,0xbd,"DOMDocument *xercesc_4_0::DOMNodeImpl::getOwnerDocument() const");
      }
    }
    else {
      iVar2 = (*pp_Var1[0xc])();
      if ((DOMDocument *)CONCAT44(extraout_var,iVar2) != (DOMDocument *)0x0) {
        return (DOMDocument *)CONCAT44(extraout_var,iVar2);
      }
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[4])();
      if (iVar2 != 9) {
        __assert_fail("fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE",
                      "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeImpl.cpp"
                      ,0xb6,"DOMDocument *xercesc_4_0::DOMNodeImpl::getOwnerDocument() const");
      }
    }
    pDVar5 = (DOMDocument *)(this->fOwnerNode + -3);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      pDVar5 = (DOMDocument *)0x0;
    }
  }
  return pDVar5;
}

Assistant:

DOMDocument *DOMNodeImpl::getOwnerDocument() const
{
    if (!this->isLeafNode())
    {
        const DOMNode *ep = getContainingNode();
        const DOMParentNode* parent = castToParentImpl(getContainingNode());
        return parent ? parent->fOwnerDocument : 0;
    }

    //  Leaf node types - those that cannot have children, like Text.
    if (isOwned()) {

        DOMDocument* ownerDoc = fOwnerNode->getOwnerDocument();

        if (!ownerDoc) {

            assert (fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE);
            return  (DOMDocument *)fOwnerNode;
        }
        else {
            return ownerDoc;
        }
    } else {
        assert (fOwnerNode->getNodeType() == DOMNode::DOCUMENT_NODE);
        return  (DOMDocument *)fOwnerNode;
    }
}